

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O3

void __thiscall SoundConfigTab::apply(SoundConfigTab *this,MidiConfig *midiConfig)

{
  bool enabled;
  int iVar1;
  
  enabled = (bool)QGroupBox::isChecked();
  MidiConfig::setEnabled(midiConfig,enabled);
  if (enabled != false) {
    iVar1 = QComboBox::currentIndex();
    MidiConfig::setBackendIndex(midiConfig,iVar1);
    iVar1 = QComboBox::currentIndex();
    MidiConfig::setPortIndex(midiConfig,iVar1);
  }
  ConfigTab::clean(&this->super_ConfigTab);
  return;
}

Assistant:

void SoundConfigTab::apply(MidiConfig &midiConfig) {
    auto const enabled = mMidiGroup->isChecked();
    midiConfig.setEnabled(enabled);
    if (enabled) {
        midiConfig.setBackendIndex(mMidiGroup->mApiCombo->currentIndex());
        midiConfig.setPortIndex(mMidiGroup->mDeviceCombo->currentIndex());
    }

    clean();
}